

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw4_brey(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1a8b,3,0x30,0x26,0x16);
  vpatch(rom,0x12300,0x80,0x70,0x38,0x38,0x36,0x12,0x1a,0x39,0x7e,3,7,7,9,0xf,7,0x36,0x79,0xe,0x1c,
         0x1c,0x6c,0x48,0x58,0x93,0x79,0xc0,0xe0,0xe0,0x90,0xf0,0xe0,100,0x9e,0x7f,0x7f,0x7f,0x1f,
         0x1f,0x1f,0x3f,0xf,0x70,0x31,0x17,0x3f,0x20,0x73,0xff,0,0xff,0xf8,0x98,0x8a,0xf8,0x88,0xfc,
         0,0xf,0x8e,0xee,0xfc,0xc,0xfe,0xff,0,0x70);
  vpatch(rom,0x12400,0x180,0,0x61,0x21,0xe0,0x44,0x44,0x4c,0x46,3,0x86,0xce,0xef,0xf,0x1f,3,9,0x6e,
         0xfc,0xf8,0xf8,0x70,0xf8,0xf8,200,0x80,0,0,0,0x80,0,0x70,0xf8,0xf,0x1f,0x5f,0x48,0x4f,0x48,
         0x5f,0x4f,0x60,0x60,0,0xf,0,0xf,0x1f,0,0xf4,0xf4,0xf8,0xf8,0xf8,0xf8,0xfc,0,0x7c,0x3c,0x7c,
         0xfe,7,0xfe,0xfc,0,0);
  return;
}

Assistant:

static void dw4_brey(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01a8b,    3,  0x30,  0x26,  0x16);
    vpatch(rom, 0x12300,  128,  0x70,  0x38,  0x38,  0x36,  0x12,  0x1a,  0x39,  0x7e,  0x03,  0x07,  0x07,  0x09,  0x0f,  0x07,  0x36,  0x79,  0x0e,  0x1c,  0x1c,  0x6c,  0x48,  0x58,  0x93,  0x79,  0xc0,  0xe0,  0xe0,  0x90,  0xf0,  0xe0,  0x64,  0x9e,  0x7f,  0x7f,  0x7f,  0x1f,  0x1f,  0x1f,  0x3f,  0x0f,  0x70,  0x31,  0x17,  0x3f,  0x20,  0x73,  0xff,  0x00,  0xff,  0xf8,  0x98,  0x8a,  0xf8,  0x88,  0xfc,  0x00,  0x0f,  0x8e,  0xee,  0xfc,  0x0c,  0xfe,  0xff,  0x00,  0x70,  0x38,  0x38,  0x36,  0x12,  0x1a,  0x39,  0x7e,  0x03,  0x07,  0x07,  0x09,  0x0f,  0x07,  0x36,  0x79,  0x0c,  0x1b,  0x19,  0x6f,  0x4a,  0x5a,  0x9a,  0x7a,  0xc0,  0xe4,  0xe6,  0x97,  0xf0,  0xe0,  0x68,  0x98,  0x7f,  0x7f,  0x7f,  0x1f,  0x1f,  0x1f,  0x3f,  0x00,  0x70,  0x31,  0x17,  0x3f,  0x20,  0x73,  0xff,  0x00,  0xfc,  0xfc,  0x9a,  0x8a,  0xfa,  0x8a,  0xfe,  0xf2,  0x0b,  0x8b,  0xec,  0xfc,  0x0d,  0xfc,  0xfc,  0x00);
    vpatch(rom, 0x12400,  384,  0x00,  0x61,  0x21,  0xe0,  0x44,  0x44,  0x4c,  0x46,  0x03,  0x86,  0xce,  0xef,  0x0f,  0x1f,  0x03,  0x09,  0x6e,  0xfc,  0xf8,  0xf8,  0x70,  0xf8,  0xf8,  0xc8,  0x80,  0x00,  0x00,  0x00,  0x80,  0x00,  0x70,  0xf8,  0x0f,  0x1f,  0x5f,  0x48,  0x4f,  0x48,  0x5f,  0x4f,  0x60,  0x60,  0x00,  0x0f,  0x00,  0x0f,  0x1f,  0x00,  0xf4,  0xf4,  0xf8,  0xf8,  0xf8,  0xf8,  0xfc,  0x00,  0x7c,  0x3c,  0x7c,  0xfe,  0x07,  0xfe,  0xfc,  0x00,  0x00,  0x01,  0x01,  0x00,  0x04,  0x64,  0x2c,  0xe6,  0x03,  0x06,  0x0e,  0x0f,  0x0f,  0x9f,  0xc3,  0xe9,  0x6e,  0xfc,  0xf8,  0xf8,  0x70,  0xf8,  0xf8,  0xc8,  0x80,  0x00,  0x00,  0x00,  0x80,  0x00,  0x70,  0xf8,  0x3f,  0x07,  0x07,  0x0f,  0x09,  0x08,  0x1f,  0x00,  0x00,  0x1c,  0x18,  0x08,  0x06,  0x0f,  0x1f,  0x00,  0xf4,  0xf4,  0xf8,  0xf8,  0xf8,  0xf8,  0xfc,  0xf0,  0x3c,  0x1c,  0x3c,  0x7c,  0x76,  0x9e,  0xff,  0x00,  0x76,  0x3f,  0x1f,  0x1f,  0x0e,  0x1f,  0x1f,  0x13,  0x01,  0x00,  0x00,  0x00,  0x01,  0x00,  0x0e,  0x1f,  0x00,  0x80,  0x80,  0x00,  0x20,  0x23,  0x31,  0xe7,  0xc0,  0x60,  0x70,  0xf0,  0xf0,  0xfc,  0xc6,  0x17,  0x2f,  0x27,  0x07,  0x1f,  0x1f,  0x1f,  0x3f,  0x00,  0x3c,  0x38,  0x39,  0x3f,  0x60,  0x7f,  0xff,  0x00,  0xfc,  0xf0,  0xf0,  0xf0,  0xf0,  0xf0,  0xf8,  0xf0,  0x80,  0x98,  0xb8,  0xf0,  0x00,  0x90,  0xf8,  0x00,  0x76,  0x3f,  0x1f,  0x1f,  0x0e,  0x1f,  0x1f,  0x13,  0x01,  0x00,  0x00,  0x00,  0x01,  0x00,  0x0e,  0x1f,  0x00,  0x83,  0x81,  0x07,  0x22,  0x22,  0x32,  0xe2,  0xc0,  0x64,  0x76,  0xf7,  0xf0,  0xf8,  0xc0,  0x10,  0x2f,  0x27,  0x07,  0x1f,  0x1f,  0x1f,  0x3f,  0x0f,  0x3c,  0x38,  0x39,  0x7f,  0xe0,  0x7f,  0x3f,  0x00,  0xf0,  0xf8,  0xfa,  0xf2,  0xf2,  0xf2,  0xfa,  0x02,  0x86,  0x96,  0xb0,  0xf0,  0x00,  0x30,  0xf8,  0x00,  0x70,  0x38,  0xf8,  0xff,  0x5f,  0x7f,  0x7f,  0x7f,  0x03,  0xc7,  0xc7,  0xc0,  0x00,  0x00,  0x30,  0x78,  0x0e,  0x1c,  0x1c,  0xfc,  0xf8,  0xf8,  0xfc,  0xfe,  0xc0,  0xe0,  0xe0,  0x00,  0x00,  0x00,  0x0c,  0x1e,  0x2f,  0x6f,  0x4f,  0x47,  0x40,  0x40,  0x58,  0x40,  0xdf,  0x9f,  0x3f,  0x3f,  0xbf,  0x3f,  0x1f,  0x00,  0xfe,  0xe6,  0xe6,  0xf8,  0x00,  0x00,  0x0c,  0xf0,  0xfc,  0xf8,  0xf8,  0xfe,  0xff,  0xfe,  0xfc,  0x00,  0x70,  0x38,  0x38,  0x3f,  0x1f,  0x1f,  0xef,  0xff,  0x03,  0x07,  0x07,  0x00,  0x00,  0xe0,  0xe0,  0xb8,  0x0e,  0x1c,  0x1c,  0xfc,  0xf8,  0xf8,  0xfc,  0xfe,  0xc0,  0xe0,  0xe0,  0x00,  0x00,  0x00,  0x0c,  0x1e,  0xef,  0x2f,  0x4f,  0x47,  0x00,  0x00,  0x00,  0x0f,  0x9f,  0xdf,  0xbf,  0x3f,  0x3f,  0x7f,  0xff,  0x00,  0xfe,  0xe6,  0xe6,  0xf0,  0x00,  0x00,  0x00,  0x00,  0xfc,  0xf8,  0xf8,  0xfc,  0xfc,  0xfe,  0xff,  0x00);
}